

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O3

int epoll_dispatch(event_base *base,timeval *tv)

{
  undefined8 *puVar1;
  epoll_event *__events;
  event_base *base_00;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  int *piVar9;
  ulong uVar10;
  event_change *in_RDX;
  event_change *extraout_RDX;
  event_change *extraout_RDX_00;
  event_change *extraout_RDX_01;
  event_change *extraout_RDX_02;
  long lVar11;
  long lVar12;
  int local_68;
  itimerspec local_58;
  
  puVar1 = (undefined8 *)base->evbase;
  __events = (epoll_event *)*puVar1;
  if (*(int *)(puVar1 + 2) < 0) {
    if (tv == (timeval *)0x0) {
      local_68 = -1;
    }
    else {
      uVar7 = evutil_tv_to_msec_(tv);
      uVar10 = 2100000;
      if (uVar7 < 2100000) {
        uVar10 = uVar7;
      }
      local_68 = (int)uVar10;
      in_RDX = extraout_RDX;
    }
  }
  else {
    local_58.it_interval.tv_sec = 0;
    local_58.it_interval.tv_nsec = 0;
    if (tv == (timeval *)0x0) {
      local_58.it_value.tv_sec = 0;
      local_58.it_value.tv_nsec = 0;
      local_68 = -1;
    }
    else {
      local_58.it_value.tv_sec = tv->tv_sec;
      local_68 = -(uint)(local_58.it_value.tv_sec != 0 || tv->tv_usec != 0);
      local_58.it_value.tv_nsec = tv->tv_usec * 1000;
    }
    iVar4 = timerfd_settime(*(int *)(puVar1 + 2),0,&local_58,(itimerspec *)0x0);
    in_RDX = extraout_RDX_00;
    if (iVar4 < 0) {
      event_warn("timerfd_settime");
      in_RDX = extraout_RDX_01;
    }
  }
  if (0 < (base->changelist).n_changes) {
    base_00 = (event_base *)base->evbase;
    lVar11 = 0;
    lVar12 = 0;
    do {
      epoll_apply_one_change
                (base_00,(epollop *)((long)&((base->changelist).changes)->fd + lVar11),in_RDX);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0xc;
      in_RDX = extraout_RDX_02;
    } while (lVar12 < (base->changelist).n_changes);
  }
  event_changelist_remove_all_(&base->changelist,base);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar5 = epoll_wait(*(int *)((long)puVar1 + 0xc),__events,*(int *)(puVar1 + 1),local_68);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar5 == 0xffffffff) {
    piVar9 = __errno_location();
    iVar4 = 0;
    if (*piVar9 != 4) {
      event_warn("epoll_wait");
      iVar4 = -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: epoll_wait reports %d","epoll_dispatch",(ulong)uVar5);
    }
    uVar6 = *(uint *)(puVar1 + 1);
    if ((int)uVar6 < (int)uVar5) {
      epoll_dispatch_cold_1();
    }
    if (0 < (int)uVar5) {
      lVar11 = 0;
      do {
        if (*(int *)(&__events->field_0x4 + lVar11) != *(int *)(puVar1 + 2)) {
          uVar6 = *(uint *)((long)&__events->events + lVar11);
          uVar3 = 6;
          if ((uVar6 & 0x18) == 0) {
            uVar2 = (ushort)uVar6 & 1;
            uVar3 = (ushort)uVar6 & 4;
            if ((uVar6 >> 0xd & 1) == 0) {
              uVar3 = uVar3 + uVar2 * 2;
              if (uVar3 == 0) goto LAB_00234c82;
            }
            else {
              uVar3 = uVar3 + uVar2 * 2 + 0x80;
            }
          }
          evmap_io_active_(base,*(int *)(&__events->field_0x4 + lVar11),uVar3 | 0x20);
        }
LAB_00234c82:
        lVar11 = lVar11 + 0xc;
      } while ((ulong)uVar5 * 0xc != lVar11);
      uVar6 = *(uint *)(puVar1 + 1);
    }
    iVar4 = 0;
    if ((int)uVar6 < 0x1000 && uVar5 == uVar6) {
      pvVar8 = event_mm_realloc_((void *)*puVar1,(long)(int)(uVar5 * 2) * 0xc);
      iVar4 = 0;
      if (pvVar8 != (void *)0x0) {
        *puVar1 = pvVar8;
        *(uint *)(puVar1 + 1) = uVar5 * 2;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
epoll_dispatch(struct event_base *base, struct timeval *tv)
{
	struct epollop *epollop = base->evbase;
	struct epoll_event *events = epollop->events;
	int i, res;
	long timeout = -1;

#ifdef USING_TIMERFD
	if (epollop->timerfd >= 0) {
		struct itimerspec is;
		is.it_interval.tv_sec = 0;
		is.it_interval.tv_nsec = 0;
		if (tv == NULL) {
			/* No timeout; disarm the timer. */
			is.it_value.tv_sec = 0;
			is.it_value.tv_nsec = 0;
		} else {
			if (tv->tv_sec == 0 && tv->tv_usec == 0) {
				/* we need to exit immediately; timerfd can't
				 * do that. */
				timeout = 0;
			}
			is.it_value.tv_sec = tv->tv_sec;
			is.it_value.tv_nsec = tv->tv_usec * 1000;
		}
		/* TODO: we could avoid unnecessary syscalls here by only
		   calling timerfd_settime when the top timeout changes, or
		   when we're called with a different timeval.
		*/
		if (timerfd_settime(epollop->timerfd, 0, &is, NULL) < 0) {
			event_warn("timerfd_settime");
		}
	} else
#endif
	if (tv != NULL) {
		timeout = evutil_tv_to_msec_(tv);
		if (timeout < 0 || timeout > MAX_EPOLL_TIMEOUT_MSEC) {
			/* Linux kernels can wait forever if the timeout is
			 * too big; see comment on MAX_EPOLL_TIMEOUT_MSEC. */
			timeout = MAX_EPOLL_TIMEOUT_MSEC;
		}
	}

	epoll_apply_changes(base);
	event_changelist_remove_all_(&base->changelist, base);

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = epoll_wait(epollop->epfd, events, epollop->nevents, timeout);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("epoll_wait");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: epoll_wait reports %d", __func__, res));
	EVUTIL_ASSERT(res <= epollop->nevents);

	for (i = 0; i < res; i++) {
		int what = events[i].events;
		short ev = 0;
#ifdef USING_TIMERFD
		if (events[i].data.fd == epollop->timerfd)
			continue;
#endif

		if (what & (EPOLLHUP|EPOLLERR)) {
			ev = EV_READ | EV_WRITE;
		} else {
			if (what & EPOLLIN)
				ev |= EV_READ;
			if (what & EPOLLOUT)
				ev |= EV_WRITE;
			if (what & EPOLLRDHUP)
				ev |= EV_CLOSED;
		}

		if (!ev)
			continue;

		evmap_io_active_(base, events[i].data.fd, ev | EV_ET);
	}

	if (res == epollop->nevents && epollop->nevents < MAX_NEVENT) {
		/* We used all of the event space this time.  We should
		   be ready for more events next time. */
		int new_nevents = epollop->nevents * 2;
		struct epoll_event *new_events;

		new_events = mm_realloc(epollop->events,
		    new_nevents * sizeof(struct epoll_event));
		if (new_events) {
			epollop->events = new_events;
			epollop->nevents = new_nevents;
		}
	}

	return (0);
}